

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O2

int hostkey_method_ssh_dss_init
              (LIBSSH2_SESSION *session,uchar *hostkey_data,size_t hostkey_data_len,void **abstract)

{
  int iVar1;
  int iVar2;
  string_buf buf;
  size_t y_len;
  size_t g_len;
  size_t q_len;
  size_t p_len;
  uchar *y;
  uchar *g;
  uchar *q;
  uchar *p;
  EVP_PKEY *dsactx;
  
  if (*abstract != (void *)0x0) {
    hostkey_method_ssh_dss_dtor(session,abstract);
    *abstract = (void *)0x0;
  }
  iVar2 = -1;
  if (0x1a < hostkey_data_len) {
    buf.data = hostkey_data;
    buf.dataptr = hostkey_data;
    buf.len = hostkey_data_len;
    iVar1 = _libssh2_match_string(&buf,"ssh-dss");
    if (iVar1 == 0) {
      iVar1 = _libssh2_get_string(&buf,&p,&p_len);
      if (iVar1 == 0) {
        iVar1 = _libssh2_get_string(&buf,&q,&q_len);
        if (iVar1 == 0) {
          iVar1 = _libssh2_get_string(&buf,&g,&g_len);
          if (iVar1 == 0) {
            iVar1 = _libssh2_get_string(&buf,&y,&y_len);
            if (iVar1 == 0) {
              iVar1 = _libssh2_eob(&buf);
              if (iVar1 != 0) {
                iVar1 = _libssh2_dsa_new(&dsactx,p,p_len,q,q_len,g,g_len,y,y_len,(uchar *)0x0,0);
                if (iVar1 == 0) {
                  *abstract = dsactx;
                  iVar2 = 0;
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

static int
hostkey_method_ssh_dss_init(LIBSSH2_SESSION * session,
                            const unsigned char *hostkey_data,
                            size_t hostkey_data_len,
                            void **abstract)
{
    libssh2_dsa_ctx *dsactx;
    unsigned char *p, *q, *g, *y;
    size_t p_len, q_len, g_len, y_len;
    struct string_buf buf;

    if(*abstract) {
        hostkey_method_ssh_dss_dtor(session, abstract);
        *abstract = NULL;
    }

    if(hostkey_data_len < 27) {
        _libssh2_debug((session, LIBSSH2_TRACE_ERROR,
                       "host key length too short"));
        return -1;
    }

    buf.data = (unsigned char *)hostkey_data;
    buf.dataptr = buf.data;
    buf.len = hostkey_data_len;

    if(_libssh2_match_string(&buf, "ssh-dss"))
        return -1;

    if(_libssh2_get_string(&buf, &p, &p_len))
        return -1;

    if(_libssh2_get_string(&buf, &q, &q_len))
        return -1;

    if(_libssh2_get_string(&buf, &g, &g_len))
        return -1;

    if(_libssh2_get_string(&buf, &y, &y_len))
        return -1;

    if(!_libssh2_eob(&buf))
        return -1;

    if(_libssh2_dsa_new(&dsactx,
                        p, (unsigned long)p_len,
                        q, (unsigned long)q_len,
                        g, (unsigned long)g_len,
                        y, (unsigned long)y_len,
                        NULL, 0)) {
        return -1;
    }

    *abstract = dsactx;

    return 0;
}